

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

TxSize wallet::CalculateMaximumSignedTxSize
                 (CTransaction *tx,CWallet *wallet,vector<CTxOut,_std::allocator<CTxOut>_> *txouts,
                 CCoinControl *coin_control)

{
  pointer pCVar1;
  uint uVar2;
  Descriptor *desc;
  bool bVar3;
  int iVar4;
  CTxOut *txo;
  _Storage<long,_true> _Var5;
  ulong uVar6;
  int64_t iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  pointer pCVar12;
  ulong nWeight;
  pointer pCVar13;
  pointer outpoint;
  long lVar14;
  long in_FS_OFFSET;
  optional<long> oVar15;
  TxSize TVar16;
  Descriptor *local_d0;
  _Optional_payload_base<CTxIn> local_c8;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  iVar4 = 9;
  if ((0xfc < uVar8) && (iVar4 = 0xb, 0xffff < uVar8)) {
    iVar4 = (uint)(uVar8 >> 0x20 != 0) * 4 + 0xd;
  }
  uVar8 = ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  iVar9 = 1;
  if ((0xfc < uVar8) && (iVar9 = 3, 0xffff < uVar8)) {
    iVar9 = (uint)(uVar8 >> 0x20 != 0) * 4 + 5;
  }
  uVar8 = (ulong)(uint)((iVar9 + iVar4) * 4);
  pCVar12 = (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar11 = (long)pCVar1 - (long)pCVar12;
  lVar14 = (lVar11 >> 3) * -0x3333333333333333 >> 2;
  if (0 < lVar14) {
    lVar14 = lVar14 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
              ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                            *)wallet,
                           (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                            )coin_control);
      pCVar13 = pCVar12;
      if (bVar3) goto LAB_00bf19e7;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
              ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                            *)wallet,
                           (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                            )coin_control);
      pCVar13 = pCVar12 + 1;
      if (bVar3) goto LAB_00bf19e7;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
              ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                            *)wallet,
                           (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                            )coin_control);
      pCVar13 = pCVar12 + 2;
      if (bVar3) goto LAB_00bf19e7;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
              ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                            *)wallet,
                           (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                            )coin_control);
      pCVar13 = pCVar12 + 3;
      if (bVar3) goto LAB_00bf19e7;
      pCVar12 = pCVar12 + 4;
      lVar14 = lVar14 + -1;
      lVar11 = lVar11 + -0xa0;
    } while (1 < lVar14);
  }
  lVar11 = (lVar11 >> 3) * -0x3333333333333333;
  if (lVar11 != 1) {
    if (lVar11 != 2) {
      pCVar13 = pCVar1;
      if ((lVar11 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
                  ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                                *)wallet,
                               (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                                )coin_control), pCVar13 = pCVar12, bVar3)) goto LAB_00bf19e7;
      pCVar12 = pCVar12 + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
            ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                          *)wallet,
                         (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                          )coin_control);
    pCVar13 = pCVar12;
    if (bVar3) goto LAB_00bf19e7;
    pCVar12 = pCVar12 + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
          ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                        *)wallet,
                       (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        )coin_control);
  pCVar13 = pCVar12;
  if (!bVar3) {
    pCVar13 = pCVar1;
  }
LAB_00bf19e7:
  nWeight = uVar8 | 2;
  if (pCVar13 == pCVar1) {
    nWeight = uVar8;
  }
  for (pCVar12 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pCVar12 !=
      (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_finish; pCVar12 = pCVar12 + 1) {
    uVar10 = (pCVar12->scriptPubKey).super_CScriptBase._size;
    uVar2 = uVar10 - 0x1d;
    if (uVar10 < 0x1d) {
      uVar2 = uVar10;
    }
    lVar11 = (ulong)(0xffff < uVar2) * 2 + 3;
    if (uVar2 < 0xfd) {
      lVar11 = 1;
    }
    nWeight = nWeight + 0x20 + ((ulong)uVar2 + lVar11) * 4;
  }
  pCVar12 = (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pCVar12) {
    uVar10 = 1;
    uVar8 = 0;
    do {
      outpoint = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar8;
      bVar3 = CWallet::CanGrindR(wallet);
      if (coin_control == (CCoinControl *)0x0) {
LAB_00bf1aae:
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
                   &pCVar12[uVar8].scriptPubKey.super_CScriptBase);
        GetDescriptor((wallet *)&local_d0,wallet,coin_control,(CScript *)&local_58.indirect_contents
                     );
        if (0x1c < local_3c) {
          free(local_58.indirect_contents.indirect);
          local_58.indirect_contents.indirect = (char *)0x0;
        }
        desc = local_d0;
        if (local_d0 != (Descriptor *)0x0) {
          std::_Optional_payload_base<CTxIn>::_Storage<CTxIn,false>::_Storage<CTxIn_const&>
                    ((_Storage<CTxIn,false> *)&local_c8,outpoint);
          local_c8._M_engaged = true;
          oVar15 = MaxInputWeight(desc,(optional<CTxIn> *)&local_c8,coin_control,pCVar13 != pCVar1,
                                  bVar3);
          _Var5._M_value =
               oVar15.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
          if (local_c8._M_engaged == true) {
            std::_Optional_payload_base<CTxIn>::_M_destroy(&local_c8);
          }
          if (local_d0 != (Descriptor *)0x0) {
            (*local_d0->_vptr_Descriptor[1])();
          }
          if (((undefined1  [16])
               oVar15.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
          goto LAB_00bf1b80;
        }
        iVar7 = -1;
        nWeight = 0xffffffffffffffff;
        goto LAB_00bf1bd7;
      }
      oVar15 = CCoinControl::GetInputWeight(coin_control,&outpoint->prevout);
      _Var5._M_value =
           oVar15.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      if (((undefined1  [16])
           oVar15.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_00bf1aae;
LAB_00bf1b80:
      if (_Var5._M_value < 0) {
        __assert_fail("*txin_weight > -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/spend.cpp"
                      ,0x9e,
                      "TxSize wallet::CalculateMaximumSignedTxSize(const CTransaction &, const CWallet *, const std::vector<CTxOut> &, const CCoinControl *)"
                     );
      }
      nWeight = nWeight + _Var5._M_value;
      uVar8 = (ulong)uVar10;
      pCVar12 = (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar12 >> 3) * -0x3333333333333333;
      uVar10 = uVar10 + 1;
    } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
  }
  iVar7 = GetVirtualTransactionSize(nWeight,0,0);
LAB_00bf1bd7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    TVar16.weight = nWeight;
    TVar16.vsize = iVar7;
    return TVar16;
  }
  __stack_chk_fail();
}

Assistant:

TxSize CalculateMaximumSignedTxSize(const CTransaction &tx, const CWallet *wallet, const std::vector<CTxOut>& txouts, const CCoinControl* coin_control)
{
    // version + nLockTime + input count + output count
    int64_t weight = (4 + 4 + GetSizeOfCompactSize(tx.vin.size()) + GetSizeOfCompactSize(tx.vout.size())) * WITNESS_SCALE_FACTOR;
    // Whether any input spends a witness program. Necessary to run before the next loop over the
    // inputs in order to accurately compute the compactSize length for the witness data per input.
    bool is_segwit = std::any_of(txouts.begin(), txouts.end(), [&](const CTxOut& txo) {
        std::unique_ptr<Descriptor> desc{GetDescriptor(wallet, coin_control, txo.scriptPubKey)};
        if (desc) return IsSegwit(*desc);
        return false;
    });
    // Segwit marker and flag
    if (is_segwit) weight += 2;

    // Add the size of the transaction outputs.
    for (const auto& txo : tx.vout) weight += GetSerializeSize(txo) * WITNESS_SCALE_FACTOR;

    // Add the size of the transaction inputs as if they were signed.
    for (uint32_t i = 0; i < txouts.size(); i++) {
        const auto txin_weight = GetSignedTxinWeight(wallet, coin_control, tx.vin[i], txouts[i], is_segwit, wallet->CanGrindR());
        if (!txin_weight) return TxSize{-1, -1};
        assert(*txin_weight > -1);
        weight += *txin_weight;
    }

    // It's ok to use 0 as the number of sigops since we never create any pathological transaction.
    return TxSize{GetVirtualTransactionSize(weight, 0, 0), weight};
}